

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
 anon_unknown.dwarf_59e0::testImageFilebuf(string *name)

{
  _Ios_Openmode _Var1;
  pointer this;
  ulong uVar2;
  string *in_RSI;
  __uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
  in_RDI;
  __single_object filebuf;
  string imagePath;
  nullptr_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,(string *)(anonymous_namespace)::testImagesPath_abi_cxx11_);
  std::__cxx11::string::operator+=(local_30,'/');
  std::__cxx11::string::operator+=(local_30,in_RSI);
  std::make_unique<std::filebuf>();
  this = std::
         unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
         ::operator->((unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
                       *)0x10d2a4);
  _Var1 = std::operator|(_S_in,_S_bin);
  std::filebuf::open((string *)this,(_Ios_Openmode)local_30);
  std::
  unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
  ::operator->((unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
                *)0x10d2dd);
  uVar2 = std::filebuf::is_open();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<std::streambuf,std::default_delete<std::streambuf>>::
    unique_ptr<std::default_delete<std::streambuf>,void>
              ((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                *)this,in_stack_ffffffffffffff78);
  }
  else {
    std::unique_ptr<std::streambuf,std::default_delete<std::streambuf>>::
    unique_ptr<std::filebuf,std::default_delete<std::filebuf>,void>
              ((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                *)in_RSI,
               (unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
                *)CONCAT44(_Var1,in_stack_ffffffffffffff88));
  }
  std::
  unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_filebuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_filebuf<char,_std::char_traits<char>_>_>_>
                 *)this);
  std::__cxx11::string::~string(local_30);
  return (__uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
          )(tuple<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<std::streambuf> testImageFilebuf(std::string name)
{
    std::string imagePath{testImagesPath};
    imagePath += '/';
    imagePath += name;
    
    auto filebuf = std::make_unique<std::filebuf>();
    filebuf->open(imagePath, std::ios::in | std::ios::binary);
    if (filebuf->is_open())
    {
        return filebuf;
    }
    return nullptr;
}